

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.test.cpp
# Opt level: O2

void verifyChunk(TestBase *chunk)

{
  int iVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  ITransientExpression local_a8;
  char *local_98;
  char *local_90;
  undefined8 local_88;
  double local_80;
  AssertionHandler catchAssertionHandler;
  
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "1 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_a8,capturedExpression,
             ContinueOnFailure);
  local_88._0_4_ = (chunk->super_Base).MT_;
  local_a8.m_result = (int)local_88 == 1;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc500;
  local_a8._12_4_ = 1;
  local_98 = "==";
  local_90 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1a;
  capturedExpression_00.m_start = "1 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_a8,capturedExpression_00,
             ContinueOnFailure);
  local_88._0_4_ = (chunk->super_Base).MT_;
  local_a8.m_result = (int)local_88 == 1;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc500;
  local_a8._12_4_ = 1;
  local_98 = "==";
  local_90 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x12;
  capturedExpression_01.m_start = "1001 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_a8,capturedExpression_01,
             ContinueOnFailure);
  local_88._0_4_ = (chunk->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_a8.m_result = (int)local_88 == 0x3e9;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc500;
  local_a8._12_4_ = 0x3e9;
  local_98 = "==";
  local_90 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x20;
  capturedExpression_02.m_start = "1001 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_a8,capturedExpression_02,
             ContinueOnFailure);
  iVar1 = (chunk->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_a8.m_result = iVar1 == 0x3e9;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc500;
  local_a8._12_4_ = 0x3e9;
  local_98 = "==";
  local_90 = (char *)0x2;
  local_88 = CONCAT44(local_88._4_4_,iVar1);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x18;
  capturedExpression_03.m_start = "0.9991673 == chunk.AWR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)&local_a8,capturedExpression_03,
             ContinueOnFailure);
  local_80 = (chunk->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_
  ;
  local_a8.m_result = local_80 == 0.9991673;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc540;
  local_98 = (char *)0x3feff92db39771a1;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8._vptr_ITransientExpression = (_func_int **)0x17541c;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x26;
  capturedExpression_04.m_start = "0.9991673 == chunk.atomicWeightRatio()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)&local_a8,capturedExpression_04,
             ContinueOnFailure);
  local_80 = (chunk->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_
  ;
  local_a8.m_result = local_80 == 0.9991673;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001bc540;
  local_98 = (char *)0x3feff92db39771a1;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const TestBase& chunk ) {

  CHECK( 1 == chunk.MT() );
  CHECK( 1 == chunk.sectionNumber() );
  CHECK( 1001 == chunk.ZA() );
  CHECK( 1001 == chunk.targetIdentifier() );
  CHECK( 0.9991673 == chunk.AWR() );
  CHECK( 0.9991673 == chunk.atomicWeightRatio() );
}